

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhstsstore.cpp
# Opt level: O3

bool __thiscall QHstsStore::deserializePolicy(QHstsStore *this,QString *key,QHstsPolicy *policy)

{
  char cVar1;
  long in_FS_OFFSET;
  bool bVar2;
  QAnyStringView QVar3;
  bool includesSubDomains;
  qint64 expiryInMS;
  QDateTime local_a0 [15];
  bool local_91;
  longlong local_90;
  QByteArray local_88;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined8 local_58;
  undefined1 *puStack_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QVar3.m_size = (size_t)&this->store;
  QVar3.field_0.m_data = &local_48;
  QSettings::value(QVar3);
  cVar1 = QVariant::isNull();
  if (cVar1 == '\0') {
    cVar1 = QMetaType::canConvert
                      ((QMetaTypeInterface *)((ulong)puStack_30 & 0xfffffffffffffffc),
                       (QMetaTypeInterface *)
                       &QtPrivate::QMetaTypeInterfaceWrapper<QByteArray>::metaType);
    if (cVar1 != '\0') {
      local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      QVariant::toByteArray();
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      QDataStream::QDataStream((QDataStream *)&local_68,&local_88);
      local_90 = 0;
      QDataStream::operator>>((QDataStream *)&local_68,&local_90);
      if (local_58._3_1_ == '\0') {
        local_91 = false;
        QDataStream::operator>>((QDataStream *)&local_68,&local_91);
        bVar2 = local_58._3_1_ == '\0';
        if (bVar2) {
          QDateTime::fromMSecsSinceEpoch((longlong)local_a0);
          QHstsPolicy::setExpiry(policy,local_a0);
          QDateTime::~QDateTime(local_a0);
          QHstsPolicy::setIncludesSubDomains(policy,local_91);
        }
      }
      else {
        bVar2 = false;
      }
      QDataStream::~QDataStream((QDataStream *)&local_68);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,1,0x10);
        }
      }
      goto LAB_001d8995;
    }
  }
  bVar2 = false;
LAB_001d8995:
  QVariant::~QVariant((QVariant *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QHstsStore::deserializePolicy(const QString &key, QHstsPolicy &policy)
{
    Q_ASSERT(store.contains(key));

    const QVariant data(store.value(key));
    if (data.isNull() || !data.canConvert<QByteArray>())
        return false;

    const QByteArray serializedData(data.toByteArray());
    QDataStream streamer(serializedData);
    qint64 expiryInMS = 0;
    streamer >> expiryInMS;
    if (streamer.status() != QDataStream::Ok)
        return false;
    bool includesSubDomains = false;
    streamer >> includesSubDomains;
    if (streamer.status() != QDataStream::Ok)
        return false;

    policy.setExpiry(QDateTime::fromMSecsSinceEpoch(expiryInMS));
    policy.setIncludesSubDomains(includesSubDomains);

    return true;
}